

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall
ByteCodeGenerator::EmitPropStore
          (ByteCodeGenerator *this,RegSlot rhsLocation,Symbol *sym,IdentPtr pid,FuncInfo *funcInfo,
          bool isLetDecl,bool isConstDecl,bool isFncDeclVar,bool skipUseBeforeDeclarationCheck)

{
  ByteCodeWriter *this_00;
  uint uVar1;
  Scope *symScope;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  ushort uVar6;
  OpCode OVar7;
  PropertyId PVar8;
  uint uVar9;
  RegSlot RVar10;
  ByteCodeLabel labelID;
  Scope **ppSVar11;
  undefined4 *puVar12;
  Scope *scope;
  Type *pTVar13;
  char cVar14;
  uint32 slotId1;
  anon_union_4_2_6390a042_for_DynamicLoadRecord_2 slotIndex;
  ByteCodeGenerator *this_01;
  undefined7 in_register_00000089;
  int i;
  int index;
  ByteCodeGenerator *pBVar15;
  undefined1 local_b0 [8];
  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  recList;
  DynamicLoadRecord local_74;
  undefined4 *local_68;
  ByteCodeWriter *local_60;
  undefined4 local_54;
  ByteCodeGenerator *local_50;
  ByteCodeGenerator *local_48;
  PropertyId local_3c;
  RegSlot local_38;
  PropertyId envIndex;
  
  local_54 = (undefined4)CONCAT71(in_register_00000089,isLetDecl);
  envIndex._3_1_ = isConstDecl;
  local_3c = -1;
  if ((sym == (Symbol *)0x0) || ((sym->field_0x42 & 8) != 0)) {
    ppSVar11 = &this->globalScope;
  }
  else {
    ppSVar11 = &sym->scope;
  }
  symScope = *ppSVar11;
  recList._40_8_ = pid;
  local_50 = this;
  local_38 = rhsLocation;
  if (symScope == (Scope *)0x0) {
    local_60 = (ByteCodeWriter *)CONCAT71(local_60._1_7_,isFncDeclVar);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1224,"(symScope)","symScope");
    if (!bVar3) goto LAB_007ffbee;
    *puVar12 = 0;
    isFncDeclVar = (bool)(char)local_60;
  }
  pBVar15 = local_50;
  if ((sym != (Symbol *)0x0) && ((sym->field_0x43 & 0x40) != 0)) {
    if ((envIndex._3_1_ == 0) &&
       ((sym->decl != (ParseNode *)0x0 && (sym->decl->nop == knopConstDecl)))) {
      Js::ByteCodeWriter::W1(&local_50->m_writer,RuntimeTypeError,0x41f);
    }
    EmitModuleExportAccess(pBVar15,sym,StModuleSlot,local_38,funcInfo);
    return;
  }
  envIndex._2_1_ = skipUseBeforeDeclarationCheck;
  local_48 = (ByteCodeGenerator *)sym;
  if (isFncDeclVar == false) {
    local_68 = (undefined4 *)CONCAT44(local_68._4_4_,0xffffffff);
    scope = (Scope *)0x0;
    cVar14 = '\0';
  }
  else {
    local_60 = (ByteCodeWriter *)CONCAT71(local_60._1_7_,isFncDeclVar);
    scope = (Scope *)0x0;
    do {
      scope = FindScopeForSym(pBVar15,symScope,scope,&local_3c,funcInfo);
    } while (scope != symScope);
    local_68 = (undefined4 *)CONCAT44(local_68._4_4_,scope->location);
    cVar14 = (char)local_60;
  }
  pBVar15 = local_50;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>._16_8_ =
       local_50->alloc;
  local_b0 = (undefined1  [8])&PTR_IsReadOnly_014dd580;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)0x0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
  _0_4_ = 0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  if (cVar14 == '\0') {
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    local_60 = &pBVar15->m_writer;
    while (scope = FindScopeForSym(local_50,symScope,scope,&local_3c,funcInfo),
          scope != local_50->globalScope) {
      if (local_3c == -1) {
        if (scope->func != funcInfo) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x124f,"(funcInfo == scope->GetFunc())","funcInfo == scope->GetFunc()"
                            );
          if (!bVar3) goto LAB_007ffbee;
          *puVar12 = 0;
        }
        local_68 = (undefined4 *)CONCAT44(local_68._4_4_,scope->location);
      }
      if (scope == symScope) break;
      if ((scope == (Scope *)0x0) || (uVar6 = *(ushort *)&scope->field_0x44, (uVar6 & 1) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1259,"(scope && scope->GetIsDynamic())",
                           "scope && scope->GetIsDynamic()");
        if (!bVar3) goto LAB_007ffbee;
        *puVar12 = 0;
        uVar6 = *(ushort *)&scope->field_0x44;
      }
      if ((uVar6 & 2) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x125a,"(scope->GetIsObject())","scope->GetIsObject()");
        if (!bVar3) goto LAB_007ffbee;
        *puVar12 = 0;
      }
      DynamicLoadRecord::DynamicLoadRecord(&local_74);
      local_74.label = Js::ByteCodeWriter::DefineLabel(local_60);
      if (local_48 == (ByteCodeGenerator *)0x0) {
        PVar8 = *(PropertyId *)(recList._40_8_ + 0x1c);
      }
      else {
        PVar8 = Symbol::EnsurePosition((Symbol *)local_48,local_50);
      }
      uVar9 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,PVar8);
      if (scope->scopeType == ScopeType_With) {
        if (local_3c == -1) {
          Js::ByteCodeWriter::BrProperty
                    (local_60,BrOnHasProperty,local_74.label,local_68._0_4_,uVar9);
          local_74.kind = LocalWith;
LAB_007ff441:
          slotIndex.index = local_68._0_4_;
        }
        else {
          slotIndex.index = local_3c + 1;
          Js::ByteCodeWriter::BrEnvProperty
                    (local_60,BrOnHasEnvProperty,local_74.label,uVar9,slotIndex.index);
          local_74.kind = EnvWith;
        }
      }
      else {
        if (local_3c == -1) {
          Js::ByteCodeWriter::BrLocalProperty(local_60,BrOnHasLocalProperty,local_74.label,uVar9);
          local_74.kind = Local;
          goto LAB_007ff441;
        }
        slotIndex.index = local_3c + 1;
        Js::ByteCodeWriter::BrEnvProperty
                  (local_60,BrOnHasLocalEnvProperty,local_74.label,uVar9,slotIndex.index);
        local_74.kind = Env;
      }
      local_74.field_2 = slotIndex;
      JsUtil::
      List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::EnsureArray((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     *)local_b0,0);
      ((anon_union_4_2_6390a042_for_DynamicLoadRecord_2 *)
      ((long)recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
             _vptr_ReadOnlyList +
      (long)(int)recList.
                 super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                 buffer * 0xc + 8))->index = (uint32)local_74.field_2;
      *(ulong *)((long)recList.
                       super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                       ._vptr_ReadOnlyList +
                (long)(int)recList.
                           super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                           .buffer * 0xc) = CONCAT44(local_74.label,local_74.kind);
      recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
      _0_4_ = (int)recList.
                   super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                   buffer + 1;
    }
  }
  pBVar15 = local_50;
  if (local_48 == (ByteCodeGenerator *)0x0 || envIndex._2_1_ != '\0') {
    if (local_48 != (ByteCodeGenerator *)0x0) goto LAB_007ff4c8;
    PVar8 = *(PropertyId *)(recList._40_8_ + 0x1c);
LAB_007ff5a8:
    uVar1 = pBVar15->flags;
    bVar3 = (bool)((SUB41(local_54,0) | envIndex._3_1_) & (byte)(uVar1 >> 0x16) & 1);
    if ((uVar1 >> 10 & 1) == 0) {
      if ((uVar1 & 4) == 0) {
        OVar7 = GetStFldOpCode(funcInfo,true,SUB41(local_54,0),(bool)envIndex._3_1_,false,
                               pBVar15->forceStrictModeForClassComputedPropertyName);
        uVar9 = FuncInfo::FindOrAddRootObjectInlineCacheId(funcInfo,PVar8,false,true);
        Js::ByteCodeWriter::PatchableRootProperty
                  (&pBVar15->m_writer,OVar7,local_38,uVar9,false,true,true);
      }
      else {
        RVar10 = FuncInfo::GetEnvRegister(funcInfo);
        uVar9 = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar10,PVar8,false,true);
        OVar7 = GetScopedStFldOpCode(funcInfo,bVar3);
        Js::ByteCodeWriter::ElementP(&pBVar15->m_writer,OVar7,local_38,uVar9,false,true);
      }
    }
    else if ((((funcInfo->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) == 0) ||
            (bVar5 = FuncInfo::IsGlobalFunction(funcInfo), !bVar5)) {
      RVar10 = FuncInfo::GetEnvRegister(funcInfo);
      uVar9 = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar10,PVar8,false,true);
      OVar7 = GetScopedStFldOpCode(funcInfo,bVar3);
      Js::ByteCodeWriter::ElementP(&pBVar15->m_writer,OVar7,local_38,uVar9,false,true);
    }
    else {
      uVar9 = FuncInfo::FindOrAddInlineCacheId
                        (funcInfo,funcInfo->frameDisplayRegister,PVar8,false,true);
      OVar7 = GetScopedStFldOpCode(funcInfo,bVar3);
      Js::ByteCodeWriter::ElementP(&pBVar15->m_writer,OVar7,local_38,uVar9,false,true);
    }
  }
  else {
    if ((((ulong)local_48->parentScopeInfo & 0x10000) != 0) && (scope->func == funcInfo)) {
      Js::ByteCodeWriter::W1(&local_50->m_writer,RuntimeReferenceError,0x13f9);
    }
LAB_007ff4c8:
    if (((ulong)local_48->parentScopeInfo & 0x80000) != 0) {
      PVar8 = Symbol::EnsurePosition((Symbol *)local_48,pBVar15);
      goto LAB_007ff5a8;
    }
    if (((ulong)local_48->parentScopeInfo & 0x200000) == 0) {
      bVar3 = Symbol::IsInSlot((Symbol *)local_48,pBVar15,funcInfo,false);
      if (bVar3 || local_3c != -1) {
        if ((envIndex._3_1_ == 0) && (((ulong)local_48->parentScopeInfo & 0x40000) != 0)) {
          Js::ByteCodeWriter::W1(&pBVar15->m_writer,RuntimeTypeError,0x41f);
        }
        this_01 = local_48;
        RVar10 = Symbol::EnsureScopeSlot((Symbol *)local_48,pBVar15,funcInfo);
        bVar4 = (byte)local_54 | envIndex._3_1_;
        local_54 = CONCAT31((int3)((uint)local_54 >> 8),bVar4);
        if (bVar4 == 0) {
          bVar3 = NeedCheckBlockVar(this_01,(Symbol *)local_48,scope,funcInfo);
        }
        else {
          bVar3 = false;
        }
        OVar7 = GetStSlotOp(this_01,scope,local_3c,local_68._0_4_,bVar3,funcInfo);
        if (local_3c == -1) {
          if ((local_68._0_4_ == 0xffffffff) ||
             ((local_68._0_4_ != funcInfo->frameSlotsRegister &&
              (local_68._0_4_ != funcInfo->frameObjRegister)))) {
            slotId1 = scope->innerScopeIndex;
            if (slotId1 == 0xffffffff) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar12 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x12da,"(scope->HasInnerScopeIndex())",
                                 "scope->HasInnerScopeIndex()");
              if (!bVar3) {
LAB_007ffbee:
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              *puVar12 = 0;
              slotId1 = scope->innerScopeIndex;
            }
            goto LAB_007ff801;
          }
          Js::ByteCodeWriter::SlotI1
                    (&local_50->m_writer,OVar7,local_38,
                     (~*(uint *)((long)&local_48->currentBlock->pnodeNext + 4) & 2) + RVar10);
        }
        else {
          slotId1 = local_3c + 1;
LAB_007ff801:
          Js::ByteCodeWriter::SlotI2
                    (&local_50->m_writer,OVar7,local_38,slotId1,
                     (~*(uint *)((long)&local_48->currentBlock->pnodeNext + 4) & 2) + RVar10);
        }
        bVar3 = ShouldTrackDebuggerMetadata(local_50);
        pBVar15 = local_50;
        if (((byte)local_54 & bVar3) == 1) {
          if ((scope->field_0x44 & 2) != 0) {
            RVar10 = *(RegSlot *)((long)&local_48->currentTopStatement + 4);
          }
          UpdateDebuggerPropertyInitializationOffset
                    (local_50,RVar10,*(PropertyId *)&local_48->currentTopStatement,false);
        }
      }
      else {
        if (((envIndex._3_1_ == 0) &&
            (local_48->funcInfoStack != (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0)
            ) && (*(OpCode *)
                   &(local_48->funcInfoStack->
                    super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
                    super_SListNodeBase<Memory::ArenaAllocator>.next == knopConstDecl)) {
          Js::ByteCodeWriter::W1(&pBVar15->m_writer,RuntimeTypeError,0x41f);
        }
        RVar10 = *(RegSlot *)((long)&local_48->currentTopStatement + 4);
        if (RVar10 != local_38) {
          Js::ByteCodeWriter::Reg2(&pBVar15->m_writer,Ld_A,RVar10,local_38);
          bVar3 = ShouldTrackDebuggerMetadata(pBVar15);
          if ((((byte)local_54 | envIndex._3_1_) & bVar3) == 1) {
            UpdateDebuggerPropertyInitializationOffset
                      (pBVar15,*(RegSlot *)((long)&local_48->currentTopStatement + 4),
                       *(PropertyId *)&local_48->currentTopStatement,true);
          }
        }
      }
    }
    else if (((funcInfo->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) != 0) {
      Js::ByteCodeWriter::W1(&pBVar15->m_writer,RuntimeTypeError,0x13b5);
    }
  }
  if ((int)recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
           buffer != 0) {
    this_00 = &pBVar15->m_writer;
    labelID = Js::ByteCodeWriter::DefineLabel(this_00);
    Js::ByteCodeWriter::Br(this_00,labelID);
    local_60 = (ByteCodeWriter *)CONCAT44(local_60._4_4_,labelID);
    index = 0;
    local_68 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      if (local_48 == (ByteCodeGenerator *)0x0) {
        PVar8 = *(PropertyId *)(recList._40_8_ + 0x1c);
      }
      else {
        PVar8 = Symbol::EnsurePosition((Symbol *)local_48,local_50);
      }
      pTVar13 = JsUtil::
                List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)local_b0,index);
      Js::ByteCodeWriter::MarkLabel(this_00,pTVar13->label);
      pTVar13 = JsUtil::
                List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)local_b0,index);
      switch(pTVar13->kind) {
      case Local:
        pTVar13 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_b0,index);
        uVar9 = FuncInfo::FindOrAddInlineCacheId
                          (funcInfo,(pTVar13->field_2).instance,PVar8,false,true);
        Js::ByteCodeWriter::ElementP(this_00,StLocalFld,local_38,uVar9,false,true);
        goto LAB_007fface;
      case Env:
        RVar10 = FuncInfo::AcquireTmpRegister(funcInfo);
        pTVar13 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_b0,index);
        Js::ByteCodeWriter::SlotI1(this_00,LdEnvObj,RVar10,(pTVar13->field_2).index);
        uVar9 = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar10,PVar8,false,true);
        Js::ByteCodeWriter::PatchableProperty(this_00,StFld,local_38,RVar10,uVar9,false,true);
        break;
      case LocalWith:
        RVar10 = FuncInfo::AcquireTmpRegister(funcInfo);
        pTVar13 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_b0,index);
        Js::ByteCodeWriter::Reg2(this_00,UnwrapWithObj,RVar10,(pTVar13->field_2).instance);
        uVar9 = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar10,PVar8,false,true);
        Js::ByteCodeWriter::PatchableProperty(this_00,StFld,local_38,RVar10,uVar9,false,true);
        break;
      case EnvWith:
        RVar10 = FuncInfo::AcquireTmpRegister(funcInfo);
        pTVar13 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_b0,index);
        Js::ByteCodeWriter::SlotI1(this_00,LdEnvObj,RVar10,(pTVar13->field_2).index);
        Js::ByteCodeWriter::Reg2(this_00,UnwrapWithObj,RVar10,RVar10);
        uVar9 = FuncInfo::FindOrAddInlineCacheId(funcInfo,RVar10,PVar8,false,true);
        Js::ByteCodeWriter::PatchableProperty(this_00,StFld,local_38,RVar10,uVar9,false,true);
        break;
      default:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_68 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1326,"((0))","(0)");
        if (bVar3) {
          *local_68 = 0;
          goto LAB_007fface;
        }
        goto LAB_007ffbee;
      }
      FuncInfo::ReleaseTmpRegister(funcInfo,RVar10);
LAB_007fface:
      if (index == (int)recList.
                        super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                        .buffer + -1) goto LAB_007ffaee;
      Js::ByteCodeWriter::Br(this_00,(ByteCodeLabel)local_60);
      index = index + 1;
    } while( true );
  }
LAB_007ffaf9:
  local_b0 = (undefined1  [8])&PTR_IsReadOnly_014dd580;
  if (recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
      _vptr_ReadOnlyList != (_func_int **)0x0) {
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
               recList.
               super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>._16_8_
               ,recList.
                super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                _vptr_ReadOnlyList,
               (long)(int)recList.
                          super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                          .alloc * 0xc);
  }
  return;
LAB_007ffaee:
  Js::ByteCodeWriter::MarkLabel(this_00,(ByteCodeLabel)local_60);
  goto LAB_007ffaf9;
}

Assistant:

void ByteCodeGenerator::EmitPropStore(Js::RegSlot rhsLocation, Symbol *sym, IdentPtr pid, FuncInfo *funcInfo, bool isLetDecl, bool isConstDecl, bool isFncDeclVar, bool skipUseBeforeDeclarationCheck)
{
    Js::PropertyId envIndex = -1;
    Scope *symScope = sym == nullptr || sym->GetIsGlobal() ? this->globalScope : sym->GetScope();
    Assert(symScope);
    // isFncDeclVar denotes that the symbol being stored to here is the var
    // binding of a function declaration and we know we want to store directly
    // to it, skipping over any dynamic scopes that may lie in between.
    Scope *scope = nullptr;
    Js::RegSlot scopeLocation = Js::Constants::NoRegister;
    Js::OpCode op;

    if (sym && sym->GetIsModuleExportStorage())
    {
        if (!isConstDecl && sym->GetDecl() && sym->GetDecl()->nop == knopConstDecl)
        {
            this->m_writer.W1(Js::OpCode::RuntimeTypeError, SCODE_CODE(ERRAssignmentToConst));
        }

        EmitModuleExportAccess(sym, Js::OpCode::StModuleSlot, rhsLocation, funcInfo);
        return;
    }

    if (isFncDeclVar)
    {
        // async functions allow for the fncDeclVar to be in the body or parameter scope
        // of the parent function, so we need to calculate envIndex in lieu of the while
        // loop below.
        do
        {
            scope = this->FindScopeForSym(symScope, scope, &envIndex, funcInfo);
        } while (scope != symScope);
        Assert(scope == symScope);
        scopeLocation = scope->GetLocation();
    }

    JsUtil::List<DynamicLoadRecord, ArenaAllocator> recList(this->alloc);

    while (!isFncDeclVar)
    {
        scope = this->FindScopeForSym(symScope, scope, &envIndex, funcInfo);
        if (scope == this->globalScope)
        {
            break;
        }
        if (envIndex == -1)
        {
            Assert(funcInfo == scope->GetFunc());
            scopeLocation = scope->GetLocation();
        }

        if (scope == symScope)
        {
            break;
        }

        // Found a scope to which the property may have been added.
        Assert(scope && scope->GetIsDynamic());
        AssertOrFailFast(scope->GetIsObject());

        DynamicLoadRecord rec;

        rec.label = this->m_writer.DefineLabel();
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        Js::PropertyIdIndexType propertyIndex = funcInfo->FindOrAddReferencedPropertyId(propertyId);

        if (scope->GetScopeType() != ScopeType_With)
        {
            if (envIndex == -1)
            {
                this->m_writer.BrLocalProperty(Js::OpCode::BrOnHasLocalProperty, rec.label, propertyIndex);
                rec.kind = DynamicLoadKind::Local;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasLocalEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::Env;
                rec.index = frameDisplayIndex;
            }
        }
        else
        {
            if (envIndex == -1)
            {
                this->m_writer.BrProperty(Js::OpCode::BrOnHasProperty, rec.label, scopeLocation, propertyIndex);
                rec.kind = DynamicLoadKind::LocalWith;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::EnvWith;
                rec.index = frameDisplayIndex;
            }
        }

        recList.Add(rec);
    }

    // Arrived at the scope in which the property was defined.
    if (!skipUseBeforeDeclarationCheck && sym && sym->GetNeedDeclaration() && scope->GetFunc() == funcInfo)
    {
        EmitUseBeforeDeclarationRuntimeError(this, Js::Constants::NoRegister);
        // Intentionally continue on to do normal EmitPropStore behavior so
        // that the bytecode ends up well-formed for the backend.  This is
        // in contrast to EmitPropLoad and EmitPropTypeof where they both
        // tell EmitUseBeforeDeclarationRuntimeError to emit a LdUndef in place
        // of their load and then they skip emitting their own bytecode.
        // Potayto potahto.
    }

    if (sym == nullptr || sym->GetIsGlobal())
    {
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        bool isConsoleScopeLetConst = this->IsConsoleScopeEval() && (isLetDecl || isConstDecl);
        if (this->flags & fscrEval)
        {
            if (funcInfo->byteCodeFunction->GetIsStrictMode() && funcInfo->IsGlobalFunction())
            {
                uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->frameDisplayRegister, propertyId, false, true);
                this->m_writer.ElementP(GetScopedStFldOpCode(funcInfo, isConsoleScopeLetConst), rhsLocation, cacheId);
            }
            else
            {
                uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->GetEnvRegister(), propertyId, false, true);
                // In "eval", store to a symbol with unknown scope goes through the closure environment.
                this->m_writer.ElementP(GetScopedStFldOpCode(funcInfo, isConsoleScopeLetConst), rhsLocation, cacheId);
            }
        }
        else if (this->flags & fscrImplicitThis)
        {
            uint cacheId = funcInfo->FindOrAddInlineCacheId(funcInfo->GetEnvRegister(), propertyId, false, true);

            // In HTML event handler, store to a symbol with unknown scope goes through the closure environment.
            this->m_writer.ElementP(GetScopedStFldOpCode(funcInfo, isConsoleScopeLetConst), rhsLocation, cacheId);
        }
        else
        {
            this->EmitPatchableRootProperty(GetStFldOpCode(funcInfo, true, isLetDecl, isConstDecl, false, forceStrictModeForClassComputedPropertyName), rhsLocation, propertyId, false, true, funcInfo);
        }
    }
    else if (sym->GetIsFuncExpr())
    {
        // Store to function expr variable.

        // strict mode: we need to throw type error
        if (funcInfo->byteCodeFunction->GetIsStrictMode())
        {
            // Note that in this case the sym's location belongs to the parent function, so we can't use it.
            // It doesn't matter which register we use, as long as it's valid for this function.
            this->m_writer.W1(Js::OpCode::RuntimeTypeError, SCODE_CODE(JSERR_CantAssignToReadOnly));
        }
    }
    else if (sym->IsInSlot(this, funcInfo) || envIndex != -1)
    {
        if (!isConstDecl && sym->GetIsConst())
        {
            // This is a case where const reassignment can't be proven statically (e.g., eval, with) so
            // we have to catch it at runtime.
            this->m_writer.W1(
                Js::OpCode::RuntimeTypeError, SCODE_CODE(ERRAssignmentToConst));
        }
        // Make sure the property has a slot. This will bump up the size of the slot array if necessary.
        Js::PropertyId slot = sym->EnsureScopeSlot(this, funcInfo);
        bool chkBlockVar = !isLetDecl && !isConstDecl && NeedCheckBlockVar(sym, scope, funcInfo);

        // The property is in memory rather than register. We'll have to load it from the slots.
        op = this->GetStSlotOp(scope, envIndex, scopeLocation, chkBlockVar, funcInfo);

        if (envIndex != -1)
        {
            this->m_writer.SlotI2(op, rhsLocation,
                envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var),
                slot + (sym->GetScope()->GetIsObject() ? 0 : Js::ScopeSlots::FirstSlotIndex));
        }
        else if (scopeLocation != Js::Constants::NoRegister &&
            (scopeLocation == funcInfo->frameSlotsRegister || scopeLocation == funcInfo->frameObjRegister))
        {
            this->m_writer.SlotI1(op, rhsLocation,
                slot + (sym->GetScope()->GetIsObject() ? 0 : Js::ScopeSlots::FirstSlotIndex));
        }
        else
        {
            Assert(scope->HasInnerScopeIndex());
            this->m_writer.SlotI2(op, rhsLocation, scope->GetInnerScopeIndex(),
                slot + (sym->GetScope()->GetIsObject() ? 0 : Js::ScopeSlots::FirstSlotIndex));
        }

        if (this->ShouldTrackDebuggerMetadata() && (isLetDecl || isConstDecl))
        {
            Js::PropertyId location = scope->GetIsObject() ? sym->GetLocation() : slot;
            this->UpdateDebuggerPropertyInitializationOffset(location, sym->GetPosition(), false);
        }
    }
    else
    {
        if (!isConstDecl && sym->GetDecl() && sym->GetDecl()->nop == knopConstDecl)
        {
            // This is a case where const reassignment can't be proven statically (e.g., eval, with) so
            // we have to catch it at runtime.
            this->m_writer.W1(Js::OpCode::RuntimeTypeError, SCODE_CODE(ERRAssignmentToConst));
        }
        if (rhsLocation != sym->GetLocation())
        {
            this->m_writer.Reg2(Js::OpCode::Ld_A, sym->GetLocation(), rhsLocation);

            if (this->ShouldTrackDebuggerMetadata() && (isLetDecl || isConstDecl))
            {
                this->UpdateDebuggerPropertyInitializationOffset(sym->GetLocation(), sym->GetPosition());
            }
        }
    }

    
    if (!recList.Empty())
    {
        Js::ByteCodeLabel doneLabel = this->m_writer.DefineLabel();
        this->m_writer.Br(doneLabel);

        for (int i = 0;; i++)
        {
            uint cacheId;
            Js::RegSlot instLocation;
            Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();

            this->m_writer.MarkLabel(recList.Item(i).label);
            switch(recList.Item(i).kind)
            {
                case DynamicLoadKind::Local:
                    cacheId = funcInfo->FindOrAddInlineCacheId(recList.Item(i).instance, propertyId, false, true);
                    this->m_writer.ElementP(Js::OpCode::StLocalFld, rhsLocation, cacheId);
                    break;

                case DynamicLoadKind::Env:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    cacheId = funcInfo->FindOrAddInlineCacheId(instLocation, propertyId, false, true);
                    this->m_writer.PatchableProperty(Js::OpCode::StFld, rhsLocation, instLocation, cacheId);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::LocalWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, recList.Item(i).instance);
                    cacheId = funcInfo->FindOrAddInlineCacheId(instLocation, propertyId, false, true);
                    this->m_writer.PatchableProperty(Js::OpCode::StFld, rhsLocation, instLocation, cacheId);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::EnvWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, instLocation);
                    cacheId = funcInfo->FindOrAddInlineCacheId(instLocation, propertyId, false, true);
                    this->m_writer.PatchableProperty(Js::OpCode::StFld, rhsLocation, instLocation, cacheId);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                default:
                    AssertOrFailFast(UNREACHED);
            }

            if (i == recList.Count() - 1)
            {
                break;
            }
            this->m_writer.Br(doneLabel);
        }
        this->m_writer.MarkLabel(doneLabel);
    }
}